

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

void quicly_sendstate_init_closed(quicly_sendstate_t *state)

{
  long *in_RDI;
  
  quicly_sendstate_init((quicly_sendstate_t *)0x15ed3e);
  *(undefined8 *)(*in_RDI + 8) = 1;
  in_RDI[0xb] = 0;
  return;
}

Assistant:

void quicly_sendstate_init_closed(quicly_sendstate_t *state)
{
    quicly_sendstate_init(state);
    state->acked.ranges[0].end = 1;
    state->final_size = 0;
}